

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperatorExpressions.cpp
# Opt level: O0

ConstantValue * __thiscall
slang::ast::ValueRangeExpression::checkInside
          (ValueRangeExpression *this,EvalContext *context,ConstantValue *val)

{
  SourceRange range;
  SourceRange range_00;
  SourceRange range_01;
  SourceRange range_02;
  bool bVar1;
  undefined1 uVar2;
  byte bVar3;
  Expression *pEVar4;
  undefined8 in_RDX;
  ValueRangeExpression *in_RSI;
  ConstantValue *in_RDI;
  ConstantValue *in_stack_000001f8;
  ConstantValue *in_stack_00000200;
  BinaryOperator in_stack_0000020c;
  ConstantValue upper;
  ConstantValue lower;
  Type *common;
  Type *lt;
  ConstantValue l;
  Compilation *comp;
  anon_class_8_1_bc11688f convert;
  ConstantValue cvr;
  ConstantValue cvl;
  ConstantValue *in_stack_fffffffffffffad8;
  ConstantValue *pCVar5;
  real_t in_stack_fffffffffffffae0;
  undefined4 in_stack_fffffffffffffae8;
  undefined1 in_stack_fffffffffffffaec;
  undefined1 in_stack_fffffffffffffaed;
  undefined1 in_stack_fffffffffffffaee;
  undefined1 in_stack_fffffffffffffaef;
  Expression *in_stack_fffffffffffffaf0;
  undefined8 in_stack_fffffffffffffb00;
  undefined2 uVar6;
  Type *in_stack_fffffffffffffb08;
  Type *in_stack_fffffffffffffb10;
  Compilation *in_stack_fffffffffffffb18;
  undefined4 in_stack_fffffffffffffb48;
  undefined4 in_stack_fffffffffffffb4c;
  Type *in_stack_fffffffffffffb50;
  Type *from;
  undefined7 in_stack_fffffffffffffb58;
  undefined1 in_stack_fffffffffffffb5f;
  SourceLocation in_stack_fffffffffffffb60;
  SourceLocation SVar7;
  SourceLocation in_stack_fffffffffffffb68;
  SourceLocation SVar8;
  ConstantValue *in_stack_fffffffffffffb80;
  real_t local_230 [8];
  real_t local_1f0 [6];
  Type local_1c0;
  undefined1 local_170 [40];
  SourceLocation local_148;
  SourceLocation SStack_140;
  undefined1 local_130 [40];
  SourceLocation local_108;
  SourceLocation SStack_100;
  Type *local_c8;
  Type *local_c0;
  ConstantValue local_b8;
  Compilation *local_90;
  undefined8 local_88;
  undefined4 local_80;
  ConstantValue local_70 [2];
  undefined8 local_18;
  
  uVar6 = (undefined2)((ulong)in_stack_fffffffffffffb00 >> 0x30);
  local_18 = in_RDX;
  left(in_RSI);
  Expression::eval((Expression *)
                   CONCAT17(in_stack_fffffffffffffaef,
                            CONCAT16(in_stack_fffffffffffffaee,
                                     CONCAT15(in_stack_fffffffffffffaed,
                                              CONCAT14(in_stack_fffffffffffffaec,
                                                       in_stack_fffffffffffffae8)))),
                   (EvalContext *)in_stack_fffffffffffffae0.v);
  right(in_RSI);
  Expression::eval((Expression *)
                   CONCAT17(in_stack_fffffffffffffaef,
                            CONCAT16(in_stack_fffffffffffffaee,
                                     CONCAT15(in_stack_fffffffffffffaed,
                                              CONCAT14(in_stack_fffffffffffffaec,
                                                       in_stack_fffffffffffffae8)))),
                   (EvalContext *)in_stack_fffffffffffffae0.v);
  bVar1 = slang::ConstantValue::operator_cast_to_bool((ConstantValue *)0xf471fa);
  if ((bVar1) &&
     (bVar1 = slang::ConstantValue::operator_cast_to_bool((ConstantValue *)0xf4721d), bVar1)) {
    local_88 = local_18;
    if (in_RSI->rangeKind != Simple) {
      local_90 = EvalContext::getCompilation((EvalContext *)0xf472b7);
      if (in_RSI->rangeKind == RelativeTolerance) {
        slang::ConstantValue::ConstantValue
                  ((ConstantValue *)in_stack_fffffffffffffae0.v,in_stack_fffffffffffffad8);
        left(in_RSI);
        local_c0 = not_null<const_slang::ast::Type_*>::operator*
                             ((not_null<const_slang::ast::Type_*> *)0xf47322);
        right(in_RSI);
        not_null::operator_cast_to_Type_((not_null<const_slang::ast::Type_*> *)0xf47384);
        local_c8 = OpInfo::binaryType(in_stack_fffffffffffffb18,in_stack_fffffffffffffb10,
                                      in_stack_fffffffffffffb08,SUB21((ushort)uVar6 >> 8,0),
                                      SUB21(uVar6,0));
        pEVar4 = left(in_RSI);
        local_108 = (pEVar4->sourceRange).startLoc;
        SStack_100 = (pEVar4->sourceRange).endLoc;
        pCVar5 = &local_b8;
        range.endLoc = in_stack_fffffffffffffb68;
        range.startLoc = in_stack_fffffffffffffb60;
        checkInside::anon_class_8_1_bc11688f::operator()
                  ((anon_class_8_1_bc11688f *)
                   CONCAT17(in_stack_fffffffffffffb5f,in_stack_fffffffffffffb58),
                   in_stack_fffffffffffffb50,
                   (Type *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48),range,
                   in_stack_fffffffffffffb80);
        slang::ConstantValue::operator=((ConstantValue *)in_stack_fffffffffffffae0.v,pCVar5);
        slang::ConstantValue::~ConstantValue((ConstantValue *)0xf47485);
        right(in_RSI);
        not_null<const_slang::ast::Type_*>::operator*
                  ((not_null<const_slang::ast::Type_*> *)0xf474ad);
        pEVar4 = right(in_RSI);
        local_148 = (pEVar4->sourceRange).startLoc;
        SStack_140 = (pEVar4->sourceRange).endLoc;
        in_stack_fffffffffffffad8 = local_70;
        range_00.endLoc = in_stack_fffffffffffffb68;
        range_00.startLoc = in_stack_fffffffffffffb60;
        checkInside::anon_class_8_1_bc11688f::operator()
                  ((anon_class_8_1_bc11688f *)
                   CONCAT17(in_stack_fffffffffffffb5f,in_stack_fffffffffffffb58),
                   in_stack_fffffffffffffb50,
                   (Type *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48),range_00,
                   (ConstantValue *)pEVar4);
        SVar8 = (SourceLocation)local_130;
        slang::ConstantValue::operator=
                  ((ConstantValue *)in_stack_fffffffffffffae0.v,in_stack_fffffffffffffad8);
        slang::ConstantValue::~ConstantValue((ConstantValue *)0xf47569);
        OpInfo::eval(in_stack_0000020c,in_stack_00000200,in_stack_000001f8);
        slang::ConstantValue::convertToReal((ConstantValue *)in_stack_fffffffffffffb08);
        SVar7 = (SourceLocation)local_170;
        slang::ConstantValue::operator=
                  ((ConstantValue *)in_stack_fffffffffffffae0.v,in_stack_fffffffffffffad8);
        slang::ConstantValue::~ConstantValue((ConstantValue *)0xf475ce);
        slang::ConstantValue::~ConstantValue((ConstantValue *)0xf475db);
        real_t::real_t(local_1f0,100.0);
        slang::ConstantValue::ConstantValue(in_stack_fffffffffffffad8,in_stack_fffffffffffffae0);
        OpInfo::eval(in_stack_0000020c,in_stack_00000200,in_stack_000001f8);
        from = &local_1c0;
        slang::ConstantValue::operator=
                  ((ConstantValue *)in_stack_fffffffffffffae0.v,in_stack_fffffffffffffad8);
        slang::ConstantValue::~ConstantValue((ConstantValue *)0xf47652);
        slang::ConstantValue::~ConstantValue((ConstantValue *)0xf4765f);
        uVar2 = Type::isIntegral((Type *)in_stack_fffffffffffffae0.v);
        if ((bool)uVar2) {
          Type::getBitWidth((Type *)CONCAT17(in_stack_fffffffffffffaef,
                                             CONCAT16(in_stack_fffffffffffffaee,
                                                      CONCAT15(in_stack_fffffffffffffaed,
                                                               CONCAT14(in_stack_fffffffffffffaec,
                                                                        in_stack_fffffffffffffae8)))
                                            ));
          local_230[0] = slang::ConstantValue::real(in_stack_fffffffffffffad8);
          real_t::operator_cast_to_double(local_230);
          Type::isSigned((Type *)in_stack_fffffffffffffae0.v);
          SVInt::fromDouble(CONCAT13(in_stack_fffffffffffffaef,
                                     CONCAT12(in_stack_fffffffffffffaee,
                                              CONCAT11(in_stack_fffffffffffffaed,
                                                       in_stack_fffffffffffffaec))),
                            in_stack_fffffffffffffae0.v,
                            SUB81((ulong)in_stack_fffffffffffffad8 >> 0x38,0),
                            SUB81((ulong)in_stack_fffffffffffffad8 >> 0x30,0));
          slang::ConstantValue::ConstantValue
                    ((ConstantValue *)in_stack_fffffffffffffae0.v,(SVInt *)in_stack_fffffffffffffad8
                    );
          slang::ConstantValue::operator=
                    ((ConstantValue *)in_stack_fffffffffffffae0.v,in_stack_fffffffffffffad8);
          slang::ConstantValue::~ConstantValue((ConstantValue *)0xf47742);
          SVInt::~SVInt((SVInt *)in_stack_fffffffffffffaf0);
        }
        else {
          Compilation::getRealType(local_90);
          right(in_RSI);
          in_stack_fffffffffffffad8 = local_70;
          range_01.endLoc = SVar8;
          range_01.startLoc = SVar7;
          checkInside::anon_class_8_1_bc11688f::operator()
                    ((anon_class_8_1_bc11688f *)CONCAT17(uVar2,in_stack_fffffffffffffb58),from,
                     (Type *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48),range_01,
                     (ConstantValue *)pEVar4);
          slang::ConstantValue::operator=
                    ((ConstantValue *)in_stack_fffffffffffffae0.v,in_stack_fffffffffffffad8);
          slang::ConstantValue::~ConstantValue((ConstantValue *)0xf47886);
        }
        slang::ConstantValue::~ConstantValue((ConstantValue *)0xf47893);
      }
      else {
        right(in_RSI);
        not_null<const_slang::ast::Type_*>::operator*
                  ((not_null<const_slang::ast::Type_*> *)0xf478cc);
        left(in_RSI);
        not_null<const_slang::ast::Type_*>::operator*
                  ((not_null<const_slang::ast::Type_*> *)0xf478f5);
        in_stack_fffffffffffffaf0 = right(in_RSI);
        in_stack_fffffffffffffad8 = local_70;
        range_02.endLoc = in_stack_fffffffffffffb68;
        range_02.startLoc = in_stack_fffffffffffffb60;
        checkInside::anon_class_8_1_bc11688f::operator()
                  ((anon_class_8_1_bc11688f *)
                   CONCAT17(in_stack_fffffffffffffb5f,in_stack_fffffffffffffb58),
                   in_stack_fffffffffffffb50,
                   (Type *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48),range_02,
                   in_stack_fffffffffffffb80);
        slang::ConstantValue::operator=
                  ((ConstantValue *)in_stack_fffffffffffffae0.v,in_stack_fffffffffffffad8);
        slang::ConstantValue::~ConstantValue((ConstantValue *)0xf47982);
      }
      OpInfo::eval(in_stack_0000020c,in_stack_00000200,in_stack_000001f8);
      OpInfo::eval(in_stack_0000020c,in_stack_00000200,in_stack_000001f8);
      OpInfo::eval(in_stack_0000020c,in_stack_00000200,in_stack_000001f8);
      bVar3 = slang::ConstantValue::isTrue((ConstantValue *)in_stack_fffffffffffffae0.v);
      slang::ConstantValue::~ConstantValue((ConstantValue *)0xf47a0b);
      if ((bVar3 & 1) == 0) {
        slang::ConstantValue::operator=
                  ((ConstantValue *)in_stack_fffffffffffffae0.v,in_stack_fffffffffffffad8);
        slang::ConstantValue::operator=
                  ((ConstantValue *)in_stack_fffffffffffffae0.v,in_stack_fffffffffffffad8);
      }
      else {
        slang::ConstantValue::operator=
                  ((ConstantValue *)in_stack_fffffffffffffae0.v,in_stack_fffffffffffffad8);
        slang::ConstantValue::operator=
                  ((ConstantValue *)in_stack_fffffffffffffae0.v,in_stack_fffffffffffffad8);
      }
      slang::ConstantValue::~ConstantValue((ConstantValue *)0xf47aca);
      slang::ConstantValue::~ConstantValue((ConstantValue *)0xf47ad7);
    }
    bVar1 = slang::ConstantValue::isUnbounded((ConstantValue *)0xf47b05);
    if (bVar1) {
      SVInt::SVInt<int>((SVInt *)in_stack_fffffffffffffae0.v,
                        (int)((ulong)in_stack_fffffffffffffad8 >> 0x20));
      slang::ConstantValue::ConstantValue
                ((ConstantValue *)in_stack_fffffffffffffae0.v,(SVInt *)in_stack_fffffffffffffad8);
      slang::ConstantValue::operator=
                ((ConstantValue *)in_stack_fffffffffffffae0.v,in_stack_fffffffffffffad8);
      slang::ConstantValue::~ConstantValue((ConstantValue *)0xf47b65);
      SVInt::~SVInt((SVInt *)in_stack_fffffffffffffaf0);
    }
    else {
      OpInfo::eval(in_stack_0000020c,in_stack_00000200,in_stack_000001f8);
      slang::ConstantValue::operator=
                ((ConstantValue *)in_stack_fffffffffffffae0.v,in_stack_fffffffffffffad8);
      slang::ConstantValue::~ConstantValue((ConstantValue *)0xf47be0);
    }
    bVar1 = slang::ConstantValue::isUnbounded((ConstantValue *)0xf47bed);
    if (bVar1) {
      SVInt::SVInt<int>((SVInt *)in_stack_fffffffffffffae0.v,
                        (int)((ulong)in_stack_fffffffffffffad8 >> 0x20));
      slang::ConstantValue::ConstantValue
                ((ConstantValue *)in_stack_fffffffffffffae0.v,(SVInt *)in_stack_fffffffffffffad8);
      slang::ConstantValue::operator=
                ((ConstantValue *)in_stack_fffffffffffffae0.v,in_stack_fffffffffffffad8);
      slang::ConstantValue::~ConstantValue((ConstantValue *)0xf47c4d);
      SVInt::~SVInt((SVInt *)in_stack_fffffffffffffaf0);
    }
    else {
      OpInfo::eval(in_stack_0000020c,in_stack_00000200,in_stack_000001f8);
      slang::ConstantValue::operator=
                ((ConstantValue *)in_stack_fffffffffffffae0.v,in_stack_fffffffffffffad8);
      slang::ConstantValue::~ConstantValue((ConstantValue *)0xf47cc8);
    }
    OpInfo::eval(in_stack_0000020c,in_stack_00000200,in_stack_000001f8);
  }
  else {
    slang::ConstantValue::ConstantValue
              ((ConstantValue *)in_stack_fffffffffffffae0.v,in_stack_fffffffffffffad8);
  }
  local_80 = 1;
  slang::ConstantValue::~ConstantValue((ConstantValue *)0xf47d04);
  slang::ConstantValue::~ConstantValue((ConstantValue *)0xf47d11);
  return in_RDI;
}

Assistant:

ConstantValue ValueRangeExpression::checkInside(EvalContext& context,
                                                const ConstantValue& val) const {
    ConstantValue cvl = left().eval(context);
    ConstantValue cvr = right().eval(context);
    if (!cvl || !cvr)
        return nullptr;

    auto convert = [&](const Type& from, const Type& to, SourceRange range, ConstantValue&& cv) {
        return ConversionExpression::convert(context, from, to, range, std::move(cv),
                                             ConversionKind::Propagated);
    };

    if (rangeKind != ValueRangeKind::Simple) {
        auto& comp = context.getCompilation();
        if (rangeKind == ValueRangeKind::RelativeTolerance) {
            // Convert both sides to the common type so we can scale them together.
            auto l = cvl;
            auto& lt = *left().type;
            auto common = OpInfo::binaryType(comp, &lt, right().type, false);
            l = convert(lt, *common, left().sourceRange, std::move(l));
            cvr = convert(*right().type, *common, right().sourceRange, std::move(cvr));

            // Final equation looks like:
            // cvr = left'(common'(cvl) * common'(cvr) / 100.0);
            cvr = OpInfo::eval(BinaryOperator::Multiply, l, cvr).convertToReal();
            cvr = OpInfo::eval(BinaryOperator::Divide, cvr, real_t(100.0));

            // Special case for the conversion: LRM says that real -> int truncates
            // instead of rounding unlike every other case in the language. shrug?
            if (lt.isIntegral()) {
                cvr = SVInt::fromDouble(lt.getBitWidth(), cvr.real(), lt.isSigned(),
                                        /* round */ false);
            }
            else {
                cvr = convert(comp.getRealType(), lt, right().sourceRange, std::move(cvr));
            }
        }
        else {
            // Convert the rhs to the lhs type.
            cvr = convert(*right().type, *left().type, right().sourceRange, std::move(cvr));
        }

        // Form the range, [A - B : A + B], swapping A and B if needed
        // to form a non-empty range.
        auto lower = OpInfo::eval(BinaryOperator::Subtract, cvl, cvr);
        auto upper = OpInfo::eval(BinaryOperator::Add, cvl, cvr);
        if (OpInfo::eval(BinaryOperator::LessThan, upper, lower).isTrue()) {
            cvl = std::move(upper);
            cvr = std::move(lower);
        }
        else {
            cvl = std::move(lower);
            cvr = std::move(upper);
        }
    }

    // If a side is unbounded, that comparison is just always true.
    if (cvl.isUnbounded())
        cvl = SVInt(1);
    else
        cvl = OpInfo::eval(BinaryOperator::GreaterThanEqual, val, cvl);

    if (cvr.isUnbounded())
        cvr = SVInt(1);
    else
        cvr = OpInfo::eval(BinaryOperator::LessThanEqual, val, cvr);

    return OpInfo::eval(BinaryOperator::LogicalAnd, cvl, cvr);
}